

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_analysis.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::cord_internal::anon_unknown_0::
AnalyzeDataEdge<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0>
          (anon_unknown_0 *this,
          CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> rep,
          RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> *raw_usage)

{
  CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> rep_00;
  bool bVar1;
  CordRepSubstring *pCVar2;
  CordRepFlat *this_00;
  CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> CVar3;
  size_t local_60;
  size_t size;
  Nonnull<const_CordRep_*> local_38;
  RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> *raw_usage_local;
  CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> rep_local;
  
  rep_local.rep = (Nonnull<const_CordRep_*>)rep.fraction;
  raw_usage_local =
       (RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> *)this;
  bVar1 = IsDataEdge((CordRep *)this);
  if (!bVar1) {
    __assert_fail("IsDataEdge(rep.rep)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord_analysis.cc"
                  ,0x78,
                  "void absl::cord_internal::(anonymous namespace)::AnalyzeDataEdge(CordRepRef<mode>, RawUsage<mode> &) [mode = absl::cord_internal::(anonymous namespace)::Mode::kFairShare]"
                 );
  }
  if (*(char *)((long)&raw_usage_local[1].total + 4) == '\x01') {
    CVar3.fraction = (double)rep_local.rep;
    CVar3.rep = (Nonnull<const_CordRep_*>)raw_usage_local;
    RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0>::Add
              ((RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> *)
               rep.rep,0x20,CVar3);
    pCVar2 = CordRep::substring((CordRep *)raw_usage_local);
    CVar3 = CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0>::Child
                      ((CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0>
                        *)&raw_usage_local,pCVar2->child);
    size = (size_t)CVar3.rep;
    raw_usage_local =
         (RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> *)size;
    local_38 = (Nonnull<const_CordRep_*>)CVar3.fraction;
    rep_local.rep = local_38;
  }
  if (*(byte *)((long)&raw_usage_local[1].total + 4) < 6) {
    local_60 = (long)raw_usage_local->total + 0x28;
  }
  else {
    this_00 = CordRep::flat((CordRep *)raw_usage_local);
    local_60 = CordRepFlat::AllocatedSize(this_00);
  }
  rep_00.fraction = (double)rep_local.rep;
  rep_00.rep = (Nonnull<const_CordRep_*>)raw_usage_local;
  RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0>::Add
            ((RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> *)rep.rep,
             local_60,rep_00);
  return;
}

Assistant:

void AnalyzeDataEdge(CordRepRef<mode> rep, RawUsage<mode>& raw_usage) {
  assert(IsDataEdge(rep.rep));

  // Consume all substrings
  if (rep.rep->tag == SUBSTRING) {
    raw_usage.Add(sizeof(CordRepSubstring), rep);
    rep = rep.Child(rep.rep->substring()->child);
  }

  // Consume FLAT / EXTERNAL
  const size_t size =
      rep.rep->tag >= FLAT
          ? rep.rep->flat()->AllocatedSize()
          : rep.rep->length + sizeof(CordRepExternalImpl<intptr_t>);
  raw_usage.Add(size, rep);
}